

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepoint_map.cpp
# Opt level: O2

string * __thiscall
HawkTracer::client::TracepointMap::category_to_string_abi_cxx11_
          (string *__return_storage_ptr__,TracepointMap *this,Category category)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if ((int)this == 2) {
    pcVar2 = "native";
    paVar1 = &local_a;
  }
  else if ((int)this == 1) {
    pcVar2 = "lua";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "default";
    paVar1 = &local_b;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string TracepointMap::category_to_string(Category category)
{
    switch (category)
    {
    case Lua:
        return "lua";
    case Native:
        return "native";
    default:
        return "default";
    }
}